

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2badaf::check(istream *is,char *c,int n)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  char v [1024];
  char local_428 [1032];
  
  std::istream::read((char *)is,(long)local_428);
  poVar3 = std::operator<<((ostream *)&std::cout,"char[");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
  std::operator<<(poVar3,"]: expected \"");
  uVar5 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    std::operator<<((ostream *)&std::cout,c[uVar5]);
  }
  std::operator<<((ostream *)&std::cout,"\", got \"");
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    std::operator<<((ostream *)&std::cout,local_428[uVar5]);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\"");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar5 = 0;
  do {
    if (uVar4 == uVar5) {
      return;
    }
    pcVar1 = c + uVar5;
    pcVar2 = local_428 + uVar5;
    uVar5 = uVar5 + 1;
  } while (*pcVar1 == *pcVar2);
  __assert_fail("c[i] == v[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,0x8e,"void (anonymous namespace)::check(istream &, const char *, int)");
}

Assistant:

void
check (istream& is, const char c[/*n*/], int n)
{
    char v[1024];

    assert (n <= (int) sizeof (v));

    Xdr::read<CharIO> (is, v, n);

    cout << "char[" << n << "]: expected \"";

    for (int i = 0; i < n; i++)
        cout << c[i];

    cout << "\", got \"";

    for (int i = 0; i < n; i++)
        cout << v[i];

    cout << "\"" << endl;

    for (int i = 0; i < n; i++)
        assert (c[i] == v[i]);
}